

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerGLSL::to_trivial_mix_op
          (CompilerGLSL *this,SPIRType *type,string *op,uint32_t left,uint32_t right,uint32_t lerp)

{
  bool bVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  float fVar5;
  double dVar6;
  bool local_9e;
  bool local_9d;
  bool local_9c;
  bool local_9b;
  bool local_9a;
  bool local_99;
  undefined1 local_80 [39];
  bool local_59;
  uint32_t row;
  bool ret;
  SPIRType *value_type;
  SPIRType *lerptype;
  SPIRConstant *cright;
  SPIRConstant *cleft;
  uint32_t local_30;
  uint32_t lerp_local;
  uint32_t right_local;
  uint32_t left_local;
  string *op_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  
  cleft._4_4_ = lerp;
  local_30 = right;
  lerp_local = left;
  _right_local = op;
  op_local = (string *)type;
  type_local = (SPIRType *)this;
  cright = Compiler::maybe_get<spirv_cross::SPIRConstant>(&this->super_Compiler,left);
  lerptype = (SPIRType *)
             Compiler::maybe_get<spirv_cross::SPIRConstant>(&this->super_Compiler,local_30);
  value_type = Compiler::expression_type(&this->super_Compiler,cleft._4_4_);
  if ((cright == (SPIRConstant *)0x0) || (lerptype == (SPIRType *)0x0)) {
    this_local._7_1_ = false;
  }
  else if (((cright->specialization & 1U) == 0) &&
          (((lerptype->image).format & ImageFormatRgba32f) == ImageFormatUnknown)) {
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(cright->super_IVariant).field_0xc);
    _row = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar3);
    if (*(int *)&(value_type->super_IVariant).field_0xc == 2) {
      if ((*(int *)&(_row->super_IVariant).field_0xc == 0xf) ||
         (bVar1 = Compiler::is_array(&this->super_Compiler,_row), bVar1)) {
        this_local._7_1_ = false;
      }
      else if ((((this->backend).use_constructor_splatting & 1U) == 0) &&
              (_row->vecsize != value_type->vecsize)) {
        this_local._7_1_ = false;
      }
      else if (_row->columns < 2) {
        local_59 = true;
        local_80._32_4_ = 0;
        while( true ) {
          bVar1 = false;
          if (local_59 != false) {
            bVar1 = (uint)local_80._32_4_ < _row->vecsize;
          }
          if (!bVar1) break;
          switch(*(undefined4 *)(op_local + 0xc)) {
          case 5:
          case 6:
            uVar2 = SPIRConstant::scalar_u16(cright,0,local_80._32_4_);
            local_99 = false;
            if (uVar2 == 0) {
              uVar2 = SPIRConstant::scalar_u16((SPIRConstant *)lerptype,0,local_80._32_4_);
              local_99 = uVar2 == 1;
            }
            local_59 = local_99;
            break;
          case 7:
          case 8:
            uVar3 = SPIRConstant::scalar(cright,0,local_80._32_4_);
            local_9a = false;
            if (uVar3 == 0) {
              uVar3 = SPIRConstant::scalar((SPIRConstant *)lerptype,0,local_80._32_4_);
              local_9a = uVar3 == 1;
            }
            local_59 = local_9a;
            break;
          case 9:
          case 10:
            uVar4 = SPIRConstant::scalar_u64(cright,0,local_80._32_4_);
            local_9e = false;
            if (uVar4 == 0) {
              uVar4 = SPIRConstant::scalar_u64((SPIRConstant *)lerptype,0,local_80._32_4_);
              local_9e = uVar4 == 1;
            }
            local_59 = local_9e;
            break;
          default:
            local_59 = false;
            break;
          case 0xc:
            fVar5 = SPIRConstant::scalar_f16(cright,0,local_80._32_4_);
            local_9b = false;
            if ((fVar5 == 0.0) && (!NAN(fVar5))) {
              fVar5 = SPIRConstant::scalar_f16((SPIRConstant *)lerptype,0,local_80._32_4_);
              local_9b = fVar5 == 1.0;
            }
            local_59 = local_9b;
            break;
          case 0xd:
            fVar5 = SPIRConstant::scalar_f32(cright,0,local_80._32_4_);
            local_9c = false;
            if ((fVar5 == 0.0) && (!NAN(fVar5))) {
              fVar5 = SPIRConstant::scalar_f32((SPIRConstant *)lerptype,0,local_80._32_4_);
              local_9c = fVar5 == 1.0;
            }
            local_59 = local_9c;
            break;
          case 0xe:
            dVar6 = SPIRConstant::scalar_f64(cright,0,local_80._32_4_);
            local_9d = false;
            if ((dVar6 == 0.0) && (!NAN(dVar6))) {
              dVar6 = SPIRConstant::scalar_f64((SPIRConstant *)lerptype,0,local_80._32_4_);
              local_9d = dVar6 == 1.0;
            }
            local_59 = local_9d;
          }
          local_80._32_4_ = local_80._32_4_ + 1;
        }
        if (local_59 != false) {
          type_to_glsl_constructor_abi_cxx11_((CompilerGLSL *)local_80,(SPIRType *)this);
          ::std::__cxx11::string::operator=((string *)_right_local,(string *)local_80);
          ::std::__cxx11::string::~string((string *)local_80);
        }
        this_local._7_1_ = (bool)(local_59 & 1);
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerGLSL::to_trivial_mix_op(const SPIRType &type, string &op, uint32_t left, uint32_t right, uint32_t lerp)
{
	auto *cleft = maybe_get<SPIRConstant>(left);
	auto *cright = maybe_get<SPIRConstant>(right);
	auto &lerptype = expression_type(lerp);

	// If our targets aren't constants, we cannot use construction.
	if (!cleft || !cright)
		return false;

	// If our targets are spec constants, we cannot use construction.
	if (cleft->specialization || cright->specialization)
		return false;

	auto &value_type = get<SPIRType>(cleft->constant_type);

	if (lerptype.basetype != SPIRType::Boolean)
		return false;
	if (value_type.basetype == SPIRType::Struct || is_array(value_type))
		return false;
	if (!backend.use_constructor_splatting && value_type.vecsize != lerptype.vecsize)
		return false;

	// Only valid way in SPIR-V 1.4 to use matrices in select is a scalar select.
	// matrix(scalar) constructor fills in diagnonals, so gets messy very quickly.
	// Just avoid this case.
	if (value_type.columns > 1)
		return false;

	// If our bool selects between 0 and 1, we can cast from bool instead, making our trivial constructor.
	bool ret = true;
	for (uint32_t row = 0; ret && row < value_type.vecsize; row++)
	{
		switch (type.basetype)
		{
		case SPIRType::Short:
		case SPIRType::UShort:
			ret = cleft->scalar_u16(0, row) == 0 && cright->scalar_u16(0, row) == 1;
			break;

		case SPIRType::Int:
		case SPIRType::UInt:
			ret = cleft->scalar(0, row) == 0 && cright->scalar(0, row) == 1;
			break;

		case SPIRType::Half:
			ret = cleft->scalar_f16(0, row) == 0.0f && cright->scalar_f16(0, row) == 1.0f;
			break;

		case SPIRType::Float:
			ret = cleft->scalar_f32(0, row) == 0.0f && cright->scalar_f32(0, row) == 1.0f;
			break;

		case SPIRType::Double:
			ret = cleft->scalar_f64(0, row) == 0.0 && cright->scalar_f64(0, row) == 1.0;
			break;

		case SPIRType::Int64:
		case SPIRType::UInt64:
			ret = cleft->scalar_u64(0, row) == 0 && cright->scalar_u64(0, row) == 1;
			break;

		default:
			ret = false;
			break;
		}
	}

	if (ret)
		op = type_to_glsl_constructor(type);
	return ret;
}